

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void sep_upsample(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                 JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                 JDIMENSION out_rows_avail)

{
  jpeg_upsampler *pjVar1;
  JDIMENSION in_stack_ffffffffffffffa8;
  uint local_54;
  jpeg_component_info *pjStack_50;
  JDIMENSION num_rows;
  jpeg_component_info *compptr;
  int ci;
  my_upsample_ptr_conflict upsample;
  JDIMENSION *out_row_ctr_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_groups_avail_local;
  JDIMENSION *in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->upsample;
  if (cinfo->max_v_samp_factor <= pjVar1[7].need_context_rows) {
    compptr._4_4_ = 0;
    pjStack_50 = cinfo->comp_info;
    for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
      (*(&pjVar1[4].upsample)[compptr._4_4_])
                (cinfo,(JSAMPIMAGE)pjStack_50,
                 (JDIMENSION *)
                 (input_buf[compptr._4_4_] +
                 *in_row_group_ctr * *(int *)((long)&pjVar1[8].start_pass + (long)compptr._4_4_ * 4)
                 ),(int)pjVar1 + 0x18 + (int)(JSAMPARRAY)((long)compptr._4_4_ << 3),
                 (JSAMPARRAY)((long)compptr._4_4_ << 3),(JDIMENSION *)(long)compptr._4_4_,
                 in_stack_ffffffffffffffa8);
      pjStack_50 = pjStack_50 + 1;
    }
    pjVar1[7].need_context_rows = 0;
  }
  local_54 = cinfo->max_v_samp_factor - pjVar1[7].need_context_rows;
  if (*(uint *)&pjVar1[7].field_0x14 < local_54) {
    local_54 = *(uint *)&pjVar1[7].field_0x14;
  }
  if (out_rows_avail - *out_row_ctr < local_54) {
    local_54 = out_rows_avail - *out_row_ctr;
  }
  (*cinfo->cconvert->color_convert)
            (cinfo,(JSAMPIMAGE)(pjVar1 + 1),pjVar1[7].need_context_rows,output_buf + *out_row_ctr,
             local_54);
  *out_row_ctr = local_54 + *out_row_ctr;
  *(uint *)&pjVar1[7].field_0x14 = *(int *)&pjVar1[7].field_0x14 - local_54;
  pjVar1[7].need_context_rows = local_54 + pjVar1[7].need_context_rows;
  if (cinfo->max_v_samp_factor <= pjVar1[7].need_context_rows) {
    *in_row_group_ctr = *in_row_group_ctr + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
sep_upsample (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
	      JDIMENSION in_row_groups_avail,
	      JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
	      JDIMENSION out_rows_avail)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  int ci;
  jpeg_component_info * compptr;
  JDIMENSION num_rows;

  /* Fill the conversion buffer, if it's empty */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor) {
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      /* Invoke per-component upsample method.  Notice we pass a POINTER
       * to color_buf[ci], so that fullsize_upsample can change it.
       */
      (*upsample->methods[ci]) (cinfo, compptr,
	input_buf[ci] + (*in_row_group_ctr * upsample->rowgroup_height[ci]),
	upsample->color_buf + ci);
    }
    upsample->next_row_out = 0;
  }

  /* Color-convert and emit rows */

  /* How many we have in the buffer: */
  num_rows = (JDIMENSION) (cinfo->max_v_samp_factor - upsample->next_row_out);
  /* Not more than the distance to the end of the image.  Need this test
   * in case the image height is not a multiple of max_v_samp_factor:
   */
  if (num_rows > upsample->rows_to_go) 
    num_rows = upsample->rows_to_go;
  /* And not more than what the client can accept: */
  out_rows_avail -= *out_row_ctr;
  if (num_rows > out_rows_avail)
    num_rows = out_rows_avail;

  (*cinfo->cconvert->color_convert) (cinfo, upsample->color_buf,
				     (JDIMENSION) upsample->next_row_out,
				     output_buf + *out_row_ctr,
				     (int) num_rows);

  /* Adjust counts */
  *out_row_ctr += num_rows;
  upsample->rows_to_go -= num_rows;
  upsample->next_row_out += num_rows;
  /* When the buffer is emptied, declare this input row group consumed */
  if (upsample->next_row_out >= cinfo->max_v_samp_factor)
    (*in_row_group_ctr)++;
}